

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void dump_nettlp(nettlp *nt)

{
  char *pcVar1;
  
  puts("======== struct nettlp ========");
  printf("port:        %d\n",(ulong)nt->port);
  pcVar1 = inet_ntoa((in_addr)(nt->remote_addr).s_addr);
  printf("remote_addr: %s\n",pcVar1);
  pcVar1 = inet_ntoa((in_addr)(nt->local_addr).s_addr);
  printf("local_addr:  %s\n",pcVar1);
  printf("requester:   %02x:%02x\n",(ulong)(nt->requester >> 8),(ulong)nt->requester & 0xff);
  printf("sockfd:      %d\n",(ulong)(uint)nt->sockfd);
  puts("===============================");
  return;
}

Assistant:

void dump_nettlp(struct nettlp *nt)
{
	printf("======== struct nettlp ========\n");
	printf("port:        %d\n", nt->port);
	printf("remote_addr: %s\n", inet_ntoa(nt->remote_addr));
	printf("local_addr:  %s\n", inet_ntoa(nt->local_addr));
	printf("requester:   %02x:%02x\n",
	       (nt->requester & 0xFF00) >> 8, nt->requester & 0x00FF);
	printf("sockfd:      %d\n", nt->sockfd);
	printf("===============================\n");
}